

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindHighestFloorPoint(sector_t *this,vertex_t **v)

{
  line_t_conflict *plVar1;
  bool bVar2;
  double dVar3;
  vertex_t *local_48;
  vertex_t *spot;
  double probeheight;
  double height;
  line_t_conflict *line;
  int i;
  vertex_t **v_local;
  sector_t_conflict *this_local;
  
  probeheight = -3.4028234663852886e+38;
  local_48 = (vertex_t *)0x0;
  bVar2 = secplane_t::isSlope(&this->floorplane);
  if (bVar2) {
    for (line._4_4_ = 0; line._4_4_ < this->linecount; line._4_4_ = line._4_4_ + 1) {
      plVar1 = this->lines[line._4_4_];
      dVar3 = secplane_t::ZatPoint(&this->floorplane,plVar1->v1);
      if (probeheight < dVar3) {
        local_48 = plVar1->v1;
        probeheight = dVar3;
      }
      dVar3 = secplane_t::ZatPoint(&this->floorplane,plVar1->v2);
      if (probeheight < dVar3) {
        local_48 = plVar1->v2;
        probeheight = dVar3;
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = local_48;
    }
    this_local = (sector_t_conflict *)probeheight;
  }
  else {
    if (v != (vertex_t **)0x0) {
      if (this->linecount == 0) {
        *v = vertexes;
      }
      else {
        *v = (*this->lines)->v1;
      }
    }
    dVar3 = secplane_t::fD(&this->floorplane);
    this_local = (sector_t_conflict *)((ulong)dVar3 ^ 0x8000000000000000);
  }
  return (double)this_local;
}

Assistant:

double sector_t::FindHighestFloorPoint (vertex_t **v) const
{
	int i;
	line_t *line;
	double height = -FLT_MAX;
	double probeheight;
	vertex_t *spot = NULL;

	if (!floorplane.isSlope())
	{
		if (v != NULL)
		{
			if (linecount == 0) *v = &vertexes[0];
			else *v = lines[0]->v1;
		}
		return -floorplane.fD();
	}

	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		probeheight = floorplane.ZatPoint(line->v1);
		if (probeheight > height)
		{
			height = probeheight;
			spot = line->v1;
		}
		probeheight = floorplane.ZatPoint(line->v2);
		if (probeheight > height)
		{
			height = probeheight;
			spot = line->v2;
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}